

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

void ReleaseHull(PHullResult *result)

{
  uint *ptr;
  
  if ((result->m_Indices).m_size != 0) {
    ptr = (result->m_Indices).m_data;
    if (ptr != (uint *)0x0) {
      if ((result->m_Indices).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
      (result->m_Indices).m_data = (uint *)0x0;
    }
    (result->m_Indices).m_ownsMemory = true;
    (result->m_Indices).m_data = (uint *)0x0;
    (result->m_Indices).m_size = 0;
    (result->m_Indices).m_capacity = 0;
  }
  result->mVcount = 0;
  result->mIndexCount = 0;
  result->mVertices = (btVector3 *)0x0;
  return;
}

Assistant:

void ReleaseHull(PHullResult &result)
{
	if ( result.m_Indices.size() )
	{
		result.m_Indices.clear();
	}

	result.mVcount = 0;
	result.mIndexCount = 0;
	result.mVertices = 0;
}